

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

Node * __thiscall Parser::declaration(Parser *this)

{
  Node *operand1;
  Node *this_00;
  allocator local_61;
  string local_60 [40];
  Node *declaration_node;
  Node *set_node;
  Parser *local_10;
  Parser *this_local;
  
  local_10 = this;
  Lexer::next_token(this->lex);
  eat_abi_cxx11_((Parser *)&set_node,(token_type)this);
  std::__cxx11::string::~string((string *)&set_node);
  Lexer::next_token(this->lex);
  declaration_node = set(this);
  this_00 = (Node *)operator_new(0x48);
  operand1 = declaration_node;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_60,"",&local_61);
  Node::Node(this_00,DCLRT,operand1,(Node *)0x0,(string *)local_60,(Node *)0x0,(Node *)0x0);
  std::__cxx11::string::~string(local_60);
  std::allocator<char>::~allocator((allocator<char> *)&local_61);
  return this_00;
}

Assistant:

Node* Parser::declaration() // ������� ������� ����������
{
	lex->next_token();
	eat(token_type::MUT);
	lex->next_token();

	Node* set_node = set();

	Node* declaration_node = new Node(node_type::DCLRT, set_node);
	return declaration_node;
}